

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_quantize_intrin_avx2.c
# Opt level: O3

void aom_highbd_quantize_b_avx2
               (tran_low_t *coeff_ptr,intptr_t n_coeffs,int16_t *zbin_ptr,int16_t *round_ptr,
               int16_t *quant_ptr,int16_t *quant_shift_ptr,tran_low_t *qcoeff_ptr,
               tran_low_t *dqcoeff_ptr,int16_t *dequant_ptr,uint16_t *eob_ptr,int16_t *scan,
               int16_t *iscan)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined8 uVar8;
  undefined8 uVar9;
  long lVar10;
  ulong uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [64];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [16];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 local_e0 [32];
  undefined1 local_c0 [32];
  undefined1 local_a0 [32];
  undefined1 local_80 [32];
  undefined1 local_60 [32];
  
  auVar12 = *(undefined1 (*) [16])zbin_ptr;
  auVar1 = *(undefined1 (*) [16])round_ptr;
  auVar2 = *(undefined1 (*) [16])quant_ptr;
  auVar3 = *(undefined1 (*) [16])dequant_ptr;
  auVar4 = *(undefined1 (*) [16])quant_shift_ptr;
  auVar17 = vpsraw_avx(auVar12,0xf);
  auVar5 = vpunpcklwd_avx(auVar12,auVar17);
  auVar12 = vpunpckhwd_avx(auVar12,auVar17);
  auVar14._0_16_ = ZEXT116(0) * auVar12 + ZEXT116(1) * auVar5;
  auVar14._16_16_ = ZEXT116(1) * auVar12;
  auVar12 = vpsraw_avx(auVar1,0xf);
  auVar5 = vpunpcklwd_avx(auVar1,auVar12);
  auVar12 = vpunpckhwd_avx(auVar1,auVar12);
  local_c0._0_16_ = ZEXT116(0) * auVar12 + ZEXT116(1) * auVar5;
  local_c0._16_16_ = ZEXT116(1) * auVar12;
  auVar12 = vpsraw_avx(auVar2,0xf);
  auVar1 = vpunpcklwd_avx(auVar2,auVar12);
  auVar12 = vpunpckhwd_avx(auVar2,auVar12);
  local_a0._0_16_ = ZEXT116(0) * auVar12 + ZEXT116(1) * auVar1;
  local_a0._16_16_ = ZEXT116(1) * auVar12;
  auVar12 = vpsraw_avx(auVar3,0xf);
  auVar1 = vpunpcklwd_avx(auVar3,auVar12);
  auVar12 = vpunpckhwd_avx(auVar3,auVar12);
  local_80._0_16_ = ZEXT116(0) * auVar12 + ZEXT116(1) * auVar1;
  local_80._16_16_ = ZEXT116(1) * auVar12;
  auVar12 = vpsraw_avx(auVar4,0xf);
  auVar1 = vpunpcklwd_avx(auVar4,auVar12);
  auVar12 = vpunpckhwd_avx(auVar4,auVar12);
  local_60._0_16_ = ZEXT116(0) * auVar12 + ZEXT116(1) * auVar1;
  local_60._16_16_ = ZEXT116(1) * auVar12;
  auVar6 = vpcmpeqd_avx2(ZEXT1632(auVar12),ZEXT1632(auVar12));
  local_e0 = vpaddd_avx2(auVar14,auVar6);
  auVar6 = *(undefined1 (*) [32])coeff_ptr;
  auVar14 = vpabsd_avx2(auVar6);
  auVar16 = vpcmpgtd_avx2(auVar14,local_e0);
  if ((((((((auVar16 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
           (auVar16 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
          (auVar16 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
         SUB321(auVar16 >> 0x7f,0) == '\0') &&
        (auVar16 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
       SUB321(auVar16 >> 0xbf,0) == '\0') &&
      (auVar16 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar16[0x1f]) {
    auVar13 = ZEXT1664((undefined1  [16])0x0);
    *(undefined1 (*) [32])qcoeff_ptr = auVar13._0_32_;
    *(undefined1 (*) [32])dqcoeff_ptr = auVar13._0_32_;
  }
  else {
    auVar14 = vpaddd_avx2(auVar14,local_c0);
    auVar14 = vpand_avx2(auVar16,auVar14);
    auVar16 = vpmuldq_avx2(auVar14,local_a0);
    auVar18 = vpsrlq_avx2(auVar14,0x20);
    auVar15 = vpsrlq_avx2(local_a0,0x20);
    auVar15 = vpmuldq_avx2(auVar18,auVar15);
    auVar18 = vpsrlq_avx2(auVar16,0x10);
    auVar16 = vpsllq_avx2(auVar15,0x10);
    auVar16 = vpblendd_avx2(auVar18,auVar16,0xaa);
    auVar14 = vpaddd_avx2(auVar14,auVar16);
    auVar16 = vpmuldq_avx2(auVar14,local_60);
    auVar14 = vpsrlq_avx2(auVar14,0x20);
    auVar15 = vpsrlq_avx2(local_60,0x20);
    auVar14 = vpmuldq_avx2(auVar14,auVar15);
    auVar16 = vpsrlq_avx2(auVar16,0x10);
    auVar14 = vpsllq_avx2(auVar14,0x10);
    auVar15 = vpblendd_avx2(auVar16,auVar14,0xaa);
    auVar16 = vpmulld_avx2(local_80,auVar15);
    auVar14 = vpcmpgtd_avx2(auVar15,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
    auVar15 = vpsignd_avx2(auVar15,auVar6);
    auVar6 = vpsignd_avx2(auVar16,auVar6);
    *(undefined1 (*) [32])qcoeff_ptr = auVar15;
    *(undefined1 (*) [32])dqcoeff_ptr = auVar6;
    auVar6 = vpackssdw_avx2(auVar14,auVar14);
    auVar16._0_16_ = ZEXT116(1) * *(undefined1 (*) [16])iscan + ZEXT116(0) * auVar6._0_16_;
    auVar16._16_16_ = ZEXT116(1) * auVar6._16_16_ + ZEXT116(0) * *(undefined1 (*) [16])iscan;
    auVar14 = vpermq_avx2(auVar6,0xd8);
    auVar6 = vpsubw_avx2(auVar16,auVar14);
    auVar6 = vpand_avx2(auVar6,auVar14);
    auVar6 = vpmaxsw_avx2(auVar6,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
    auVar13 = ZEXT3264(auVar6);
  }
  auVar12 = auVar13._0_16_;
  lVar10 = 0;
  do {
    uVar8 = *(undefined8 *)(local_c0 + lVar10);
    uVar9 = *(undefined8 *)(local_c0 + lVar10 + 8);
    *(undefined8 *)(local_e0 + lVar10) = uVar8;
    *(undefined8 *)(local_e0 + lVar10 + 8) = uVar9;
    *(undefined8 *)(local_e0 + lVar10 + 0x10) = uVar8;
    *(undefined8 *)(local_e0 + lVar10 + 0x18) = uVar9;
    lVar10 = lVar10 + 0x20;
  } while (lVar10 != 0xa0);
  if (8 < n_coeffs) {
    auVar14 = vpsrad_avx2(local_a0,0x1f);
    auVar6 = vpshufd_avx2(local_a0,0xf5);
    auVar14 = vpblendd_avx2(auVar6,auVar14,0xaa);
    auVar16 = vpsrad_avx2(local_60,0x1f);
    auVar6 = vpshufd_avx2(local_60,0xf5);
    auVar6 = vpblendd_avx2(auVar6,auVar16,0xaa);
    uVar11 = n_coeffs + 8;
    lVar10 = 0x10;
    auVar16 = vpsrlq_avx2(auVar14,0x20);
    do {
      auVar15 = *(undefined1 (*) [32])((long)coeff_ptr + lVar10 * 2);
      auVar18 = vpabsd_avx2(auVar15);
      auVar21 = vpcmpgtd_avx2(auVar18,local_e0);
      auVar19 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
      if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar21 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar21 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar21 >> 0x7f,0) == '\0') &&
            (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar21 >> 0xbf,0) == '\0') &&
          (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar21[0x1f])
      {
        *(undefined1 (*) [32])((long)qcoeff_ptr + lVar10 * 2) = auVar19;
        *(undefined1 (*) [32])((long)dqcoeff_ptr + lVar10 * 2) = auVar19;
      }
      else {
        auVar18 = vpaddd_avx2(auVar18,local_c0);
        auVar21 = vpand_avx2(auVar21,auVar18);
        auVar20 = vpmuldq_avx2(auVar21,local_a0);
        auVar22 = vpsrad_avx2(auVar21,0x1f);
        auVar7 = vpshufd_avx2(auVar21,0xf5);
        auVar18 = vpmuludq_avx2(auVar7,auVar16);
        auVar22 = vpsrlq_avx2(auVar22,0x20);
        auVar22 = vpmuludq_avx2(auVar22,auVar14);
        auVar18 = vpaddq_avx2(auVar18,auVar22);
        auVar22 = vpsllq_avx2(auVar18,0x20);
        auVar18 = vpmuludq_avx2(auVar7,auVar14);
        auVar18 = vpaddq_avx2(auVar18,auVar22);
        auVar20 = vpsrlq_avx2(auVar20,0x10);
        auVar18 = vpsllq_avx2(auVar18,0x10);
        auVar18 = vpblendd_avx2(auVar20,auVar18,0xaa);
        auVar18 = vpaddd_avx2(auVar21,auVar18);
        auVar21 = vpmuldq_avx2(auVar18,local_60);
        auVar20 = vpsrad_avx2(auVar18,0x1f);
        auVar22 = vpshufd_avx2(auVar18,0xf5);
        auVar18 = vpsrlq_avx2(auVar6,0x20);
        auVar18 = vpmuludq_avx2(auVar22,auVar18);
        auVar20 = vpsrlq_avx2(auVar20,0x20);
        auVar20 = vpmuludq_avx2(auVar20,auVar6);
        auVar18 = vpaddq_avx2(auVar18,auVar20);
        auVar20 = vpsllq_avx2(auVar18,0x20);
        auVar18 = vpmuludq_avx2(auVar22,auVar6);
        auVar18 = vpaddq_avx2(auVar18,auVar20);
        auVar21 = vpsrlq_avx2(auVar21,0x10);
        auVar18 = vpsllq_avx2(auVar18,0x10);
        auVar20 = vpblendd_avx2(auVar21,auVar18,0xaa);
        auVar21 = vpmulld_avx2(local_80,auVar20);
        auVar18 = vpcmpgtd_avx2(auVar20,auVar19);
        auVar19 = vpsignd_avx2(auVar20,auVar15);
        auVar15 = vpsignd_avx2(auVar21,auVar15);
        *(undefined1 (*) [32])((long)qcoeff_ptr + lVar10 * 2) = auVar19;
        *(undefined1 (*) [32])((long)dqcoeff_ptr + lVar10 * 2) = auVar15;
        auVar15 = vpackssdw_avx2(auVar18,auVar18);
        auVar21._0_16_ =
             ZEXT116(0) * auVar13._0_16_ + ZEXT116(1) * *(undefined1 (*) [16])((long)iscan + lVar10)
        ;
        auVar21._16_16_ =
             ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar13._0_16_;
        auVar18 = vpermq_avx2(auVar15,0xd8);
        auVar15 = vpsubw_avx2(auVar21,auVar18);
        auVar15 = vpand_avx2(auVar15,auVar18);
        auVar15 = vpmaxsw_avx2(auVar15,auVar13._0_32_);
        auVar13 = ZEXT3264(auVar15);
      }
      auVar12 = auVar13._0_16_;
      lVar10 = lVar10 + 0x10;
      uVar11 = uVar11 - 8;
    } while (0x10 < uVar11);
  }
  auVar1 = vpshufd_avx(auVar12,0xe);
  auVar12 = vpmaxsw_avx(auVar12,auVar1);
  auVar1 = vpshuflw_avx(auVar12,0xe);
  auVar12 = vpmaxsw_avx(auVar12,auVar1);
  auVar1 = vpshuflw_avx(auVar12,1);
  auVar12 = vpmaxsw_avx(auVar12,auVar1);
  vpextrw_avx(auVar12,0);
  return;
}

Assistant:

void aom_highbd_quantize_b_avx2(const tran_low_t *coeff_ptr, intptr_t n_coeffs,
                                const int16_t *zbin_ptr,
                                const int16_t *round_ptr,
                                const int16_t *quant_ptr,
                                const int16_t *quant_shift_ptr,
                                tran_low_t *qcoeff_ptr, tran_low_t *dqcoeff_ptr,
                                const int16_t *dequant_ptr, uint16_t *eob_ptr,
                                const int16_t *scan, const int16_t *iscan) {
  (void)scan;
  const int step = 8;

  __m256i eob = _mm256_setzero_si256();
  __m256i qp[5];

  init_qp(zbin_ptr, round_ptr, quant_ptr, dequant_ptr, quant_shift_ptr, qp, 0);

  quantize(qp, coeff_ptr, iscan, qcoeff_ptr, dqcoeff_ptr, &eob);

  coeff_ptr += step;
  qcoeff_ptr += step;
  dqcoeff_ptr += step;
  iscan += step;
  n_coeffs -= step;

  update_qp(qp);

  while (n_coeffs > 0) {
    quantize(qp, coeff_ptr, iscan, qcoeff_ptr, dqcoeff_ptr, &eob);

    coeff_ptr += step;
    qcoeff_ptr += step;
    dqcoeff_ptr += step;
    iscan += step;
    n_coeffs -= step;
  }

  *eob_ptr = get_max_eob(eob);
}